

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::FragmentWorkloadCullCase::logDescription
          (FragmentWorkloadCullCase *this)

{
  ostringstream *poVar1;
  TestLog *this_00;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [384];
  
  this_00 = ((this->super_RelativeChangeCase).super_BaseCase.super_TestCase.super_TestNode.m_testCtx
            )->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"Description",&local_1d1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Test description",&local_1d2);
  tcu::LogSection::LogSection((LogSection *)local_190,&local_1b0,&local_1d0);
  tcu::LogSection::write((LogSection *)local_190,(int)this_00,__buf,in_RCX);
  tcu::LogSection::~LogSection((LogSection *)local_190);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Testing effects of culled fragment workload on render time");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Geometry consists of two fullsceen quads. The first (occluding) quad uses a trivial shader,the second (occluded) contains significant fragment shader work"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Workload indicates the number of iterations of dummy work done in the occluded quad\'s fragment shader"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "The ratio of rendering times of this scene with/without depth testing are compared"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Successfull early Z-testing should result in no correlation between workload and render time"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  tcu::TestLog::endSection(this_00);
  return;
}

Assistant:

void FragmentWorkloadCullCase::logDescription (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Section("Description", "Test description");
	log << TestLog::Message << "Testing effects of culled fragment workload on render time" << TestLog::EndMessage;
	log << TestLog::Message << "Geometry consists of two fullsceen quads. The first (occluding) quad uses a trivial shader,"
		"the second (occluded) contains significant fragment shader work" << TestLog::EndMessage;
	log << TestLog::Message << "Workload indicates the number of iterations of dummy work done in the occluded quad's fragment shader"  << TestLog::EndMessage;
	log << TestLog::Message << "The ratio of rendering times of this scene with/without depth testing are compared"  << TestLog::EndMessage;
	log << TestLog::Message << "Successfull early Z-testing should result in no correlation between workload and render time"  << TestLog::EndMessage;
	log << TestLog::EndSection;
}